

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QString * __thiscall
QTzTimeZonePrivate::displayName
          (QString *__return_storage_ptr__,QTzTimeZonePrivate *this,TimeType timeType,
          NameType nameType,QLocale *locale)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Data tran;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((nameType == LongName) || (bVar2 = QTimeZonePrivate::isAnglicLocale(locale), !bVar2)) {
LAB_003b3328:
    QTimeZonePrivate::displayName
              (__return_storage_ptr__,&this->super_QTimeZonePrivate,timeType,nameType,locale);
  }
  else {
    tran._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    tran.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    data(&tran,this,timeType);
    if (nameType == ShortName) {
      (__return_storage_ptr__->d).d = tran.abbreviation.d.d;
      (__return_storage_ptr__->d).ptr = tran.abbreviation.d.ptr;
      (__return_storage_ptr__->d).size = tran.abbreviation.d.size;
      if (tran.abbreviation.d.d != (Data *)0x0) {
        LOCK();
        ((tran.abbreviation.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((tran.abbreviation.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
    }
    else {
      bVar2 = QTimeZonePrivate::isAnglicLocale(locale);
      if (!bVar2) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tran);
        goto LAB_003b3328;
      }
      QTimeZonePrivate::isoOffsetFormat(__return_storage_ptr__,tran.offsetFromUtc,OffsetName);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tran);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTzTimeZonePrivate::displayName(QTimeZone::TimeType timeType,
                                        QTimeZone::NameType nameType,
                                        const QLocale &locale) const
{
    // TZ only provides C-locale abbreviations and offset:
    if (nameType != QTimeZone::LongName && isDataLocale(locale)) {
        Data tran = data(timeType);
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            if (nameType == QTimeZone::ShortName)
                return tran.abbreviation;
            // Save base class repeating the data(timeType) query:
            if (isAnglicLocale(locale))
                return isoOffsetFormat(tran.offsetFromUtc);
        }
    }
    // Otherwise, fall back to base class (and qtimezonelocale.cpp):
    return QTimeZonePrivate::displayName(timeType, nameType, locale);
}